

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verFormula.c
# Opt level: O2

int Ver_FormulaParserFindVar(char *pString,Vec_Ptr_t *vNames)

{
  byte *pbVar1;
  int iVar2;
  void *pvVar3;
  byte bVar4;
  int iVar5;
  int i;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  
  bVar4 = *pString;
  pcVar7 = pString;
  if (bVar4 == 0x5c) {
    pcVar8 = pString + 1;
    bVar4 = 0x5c;
    while ((bVar4 & 0xdf) != 0) {
      pbVar1 = (byte *)(pcVar7 + 1);
      pcVar7 = pcVar7 + 1;
      bVar4 = *pbVar1;
    }
  }
  else {
    while (((pcVar8 = pString, 0x3f < bVar4 ||
            ((0x8400134300002601U >> ((ulong)bVar4 & 0x3f) & 1) == 0)) &&
           ((0x20 < bVar4 - 0x5e || ((0x1c0000001U >> ((ulong)(bVar4 - 0x5e) & 0x3f) & 1) == 0)))))
    {
      bVar4 = pcVar7[1];
      pcVar7 = pcVar7 + 1;
    }
  }
  iVar6 = (int)pcVar7 - (int)pcVar8;
  iVar5 = 0;
  i = 1;
  do {
    if (vNames->nSize / 2 <= iVar5) {
      Vec_PtrPush(vNames,(void *)(long)iVar6);
      Vec_PtrPush(vNames,pcVar8);
      return iVar5;
    }
    pvVar3 = Vec_PtrEntry(vNames,i + -1);
    if ((int)pvVar3 == iVar6) {
      pcVar7 = (char *)Vec_PtrEntry(vNames,i);
      iVar2 = strncmp(pcVar8,pcVar7,(size_t)(long)iVar6);
      if (iVar2 == 0) {
        return iVar5;
      }
    }
    iVar5 = iVar5 + 1;
    i = i + 2;
  } while( true );
}

Assistant:

int Ver_FormulaParserFindVar( char * pString, Vec_Ptr_t * vNames )
{
    char * pTemp, * pTemp2;
    int nLength, nLength2, i;
    // start the string
    pTemp = pString;
    // find the end of the string delimited by other characters
    if ( *pTemp == '\\' )
    {
        pString++;
        while ( *pTemp && *pTemp != ' ' )
            pTemp++;
    }
    else
    {
        while ( *pTemp && *pTemp != ' ' && *pTemp != '\t' && *pTemp != '\r' && *pTemp != '\n' && *pTemp != ',' && *pTemp != '}' && 
                *pTemp != VER_PARSE_SYM_OPEN && *pTemp != VER_PARSE_SYM_CLOSE && 
                *pTemp != VER_PARSE_SYM_NEGBEF1 && *pTemp != VER_PARSE_SYM_NEGBEF2 && 
                *pTemp != VER_PARSE_SYM_AND && *pTemp != VER_PARSE_SYM_OR && *pTemp != VER_PARSE_SYM_XOR && 
                *pTemp != VER_PARSE_SYM_MUX1 && *pTemp != VER_PARSE_SYM_MUX2 )
                pTemp++;
    }
    // look for this string in the array
    nLength = pTemp - pString;
    for ( i = 0; i < Vec_PtrSize(vNames)/2; i++ )
    {
        nLength2 = (int)(ABC_PTRUINT_T)Vec_PtrEntry( vNames, 2*i + 0 );
        if ( nLength2 != nLength )
            continue;
        pTemp2   = (char *)Vec_PtrEntry( vNames, 2*i + 1 );
        if ( strncmp( pString, pTemp2, nLength ) )
            continue;
        return i;
    }
    // could not find - add and return the number
    Vec_PtrPush( vNames, (void *)(ABC_PTRUINT_T)nLength );
    Vec_PtrPush( vNames, pString );
    return i;
}